

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int nh_http_parse_consume_body(http_context_t *ctx)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = (ctx->body).index;
  uVar1 = ctx->body_len;
  if (uVar2 == 0) {
    uVar2 = (ctx->raw).index;
    (ctx->body).index = uVar2;
  }
  uVar5 = (ctx->raw).length - uVar2;
  uVar4 = uVar1;
  if ((uVar1 < uVar5) || (uVar3 = (ctx->body).len, uVar4 = uVar5, uVar3 < uVar1)) {
    (ctx->body).len = uVar4;
    uVar3 = uVar4;
  }
  (ctx->raw).index = uVar2 + uVar3;
  return (uint)(uVar3 == uVar1);
}

Assistant:

int nh_http_parse_consume_body(http_context_t *ctx) {
    uint32_t length = ctx->body_len;
    nh_stream_t *stream = &ctx->raw;
    if (ctx->body.index == 0) ctx->body.index = stream->index;
    if (stream->length - ctx->body.index > length) {
        ctx->body.len = length;
    } else if (ctx->body.len < length) {
        ctx->body.len = stream->length - ctx->body.index;
    }
    stream->index = ctx->body.index + ctx->body.len;
    return ctx->body.len == length;
}